

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O0

uint32_t __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::DecodeSymbol
          (MeshEdgebreakerTraversalPredictiveDecoder *this)

{
  bool bVar1;
  uint32_t uVar2;
  RAnsBitDecoder *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*(int *)&in_RDI[0xb].field_0x14 == -1) ||
     (bVar1 = RAnsBitDecoder::DecodeNextBit(in_RDI), !bVar1)) {
    uVar2 = MeshEdgebreakerTraversalDecoder::DecodeSymbol
                      ((MeshEdgebreakerTraversalDecoder *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    *(uint32_t *)&in_RDI[0xb].prob_zero_ = uVar2;
    uVar2 = *(uint32_t *)&in_RDI[0xb].prob_zero_;
  }
  else {
    in_RDI[0xb].prob_zero_ = in_RDI[0xb].field_0x14;
    *(undefined3 *)&in_RDI[0xb].field_0x11 = *(undefined3 *)&in_RDI[0xb].field_0x15;
    uVar2 = *(uint32_t *)&in_RDI[0xb].field_0x14;
  }
  return uVar2;
}

Assistant:

inline uint32_t DecodeSymbol() {
    // First check if we have a predicted symbol.
    if (predicted_symbol_ != -1) {
      // Double check that the predicted symbol was predicted correctly.
      if (prediction_decoder_.DecodeNextBit()) {
        last_symbol_ = predicted_symbol_;
        return predicted_symbol_;
      }
    }
    // We don't have a predicted symbol or the symbol was mis-predicted.
    // Decode it directly.
    last_symbol_ = MeshEdgebreakerTraversalDecoder::DecodeSymbol();
    return last_symbol_;
  }